

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_init(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  undefined8 uVar2;
  long lVar3;
  undefined4 **ppuVar4;
  uv_timer_t *puVar5;
  undefined4 *unaff_RBX;
  uv_timer_t handle;
  undefined1 auStack_2c0 [152];
  code *pcStack_228;
  code *pcStack_220;
  code *pcStack_218;
  code *pcStack_210;
  code *pcStack_208;
  code *pcStack_200;
  code *pcStack_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 *apuStack_1e8 [19];
  undefined4 *apuStack_150 [19];
  undefined4 *puStack_b8;
  undefined1 local_a0 [152];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,local_a0);
  if (iVar1 == 0) {
    lVar3 = uv_timer_get_repeat(local_a0);
    if (lVar3 != 0) goto LAB_00177251;
    iVar1 = uv_is_active(local_a0);
    if (iVar1 != 0) goto LAB_00177256;
    unaff_RBX = (undefined4 *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_00177251:
    run_test_timer_init_cold_2();
LAB_00177256:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  uStack_1ec = 0;
  uStack_1f0 = 1;
  pcStack_1f8 = (code *)0x17727e;
  puStack_b8 = unaff_RBX;
  ppuVar4 = (undefined4 **)uv_default_loop();
  pcStack_1f8 = (code *)0x17728e;
  iVar1 = uv_timer_init(ppuVar4,apuStack_150);
  if (iVar1 == 0) {
    pcStack_1f8 = (code *)0x17729b;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_1f8 = (code *)0x1772a8;
    iVar1 = uv_timer_init(ppuVar4,apuStack_1e8);
    if (iVar1 != 0) goto LAB_001773f5;
    unaff_RBX = &uStack_1ec;
    ppuVar4 = apuStack_150;
    pcStack_1f8 = (code *)0x1772d0;
    apuStack_150[0] = unaff_RBX;
    iVar1 = uv_timer_start(ppuVar4,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_001773fa;
    ppuVar4 = apuStack_1e8;
    pcStack_1f8 = (code *)0x1772f3;
    apuStack_1e8[0] = &uStack_1f0;
    iVar1 = uv_timer_start(ppuVar4,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_001773ff;
    pcStack_1f8 = (code *)0x177300;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_1f8 = (code *)0x17730a;
    iVar1 = uv_run(ppuVar4,0);
    if (iVar1 != 0) goto LAB_00177404;
    if (order_cb_called != 2) goto LAB_00177409;
    ppuVar4 = apuStack_150;
    pcStack_1f8 = (code *)0x17732c;
    iVar1 = uv_timer_stop();
    if (iVar1 != 0) goto LAB_0017740e;
    ppuVar4 = apuStack_1e8;
    pcStack_1f8 = (code *)0x17733e;
    iVar1 = uv_timer_stop();
    if (iVar1 != 0) goto LAB_00177413;
    order_cb_called = 0;
    ppuVar4 = apuStack_1e8;
    pcStack_1f8 = (code *)0x177368;
    apuStack_1e8[0] = unaff_RBX;
    iVar1 = uv_timer_start(ppuVar4,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_00177418;
    ppuVar4 = apuStack_150;
    pcStack_1f8 = (code *)0x17738b;
    apuStack_150[0] = &uStack_1f0;
    iVar1 = uv_timer_start(ppuVar4,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_0017741d;
    pcStack_1f8 = (code *)0x177398;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_1f8 = (code *)0x1773a2;
    iVar1 = uv_run(ppuVar4,0);
    if (iVar1 != 0) goto LAB_00177422;
    if (order_cb_called != 2) goto LAB_00177427;
    pcStack_1f8 = (code *)0x1773b4;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_1f8 = (code *)0x1773c8;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_1f8 = (code *)0x1773d2;
    uv_run(unaff_RBX,0);
    pcStack_1f8 = (code *)0x1773d7;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_1f8 = (code *)0x1773df;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_1f8 = (code *)0x1773f5;
    run_test_timer_order_cold_1();
LAB_001773f5:
    pcStack_1f8 = (code *)0x1773fa;
    run_test_timer_order_cold_2();
LAB_001773fa:
    pcStack_1f8 = (code *)0x1773ff;
    run_test_timer_order_cold_3();
LAB_001773ff:
    pcStack_1f8 = (code *)0x177404;
    run_test_timer_order_cold_4();
LAB_00177404:
    pcStack_1f8 = (code *)0x177409;
    run_test_timer_order_cold_5();
LAB_00177409:
    pcStack_1f8 = (code *)0x17740e;
    run_test_timer_order_cold_6();
LAB_0017740e:
    pcStack_1f8 = (code *)0x177413;
    run_test_timer_order_cold_7();
LAB_00177413:
    pcStack_1f8 = (code *)0x177418;
    run_test_timer_order_cold_8();
LAB_00177418:
    pcStack_1f8 = (code *)0x17741d;
    run_test_timer_order_cold_9();
LAB_0017741d:
    pcStack_1f8 = (code *)0x177422;
    run_test_timer_order_cold_10();
LAB_00177422:
    pcStack_1f8 = (code *)0x177427;
    run_test_timer_order_cold_11();
LAB_00177427:
    pcStack_1f8 = (code *)0x17742c;
    run_test_timer_order_cold_12();
  }
  pcStack_1f8 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_1f8 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == **ppuVar4) {
    return iVar1;
  }
  pcStack_200 = order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  pcStack_200 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == **ppuVar4) {
    return iVar1;
  }
  pcStack_208 = run_test_timer_huge_timeout;
  order_cb_b_cold_1();
  pcStack_210 = (code *)0x177471;
  pcStack_208 = (code *)unaff_RBX;
  puVar5 = (uv_timer_t *)uv_default_loop();
  pcStack_210 = (code *)0x177480;
  iVar1 = uv_timer_init(puVar5,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_210 = (code *)0x17748d;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_210 = (code *)0x17749c;
    iVar1 = uv_timer_init(puVar5,&huge_timer1);
    if (iVar1 != 0) goto LAB_00177575;
    pcStack_210 = (code *)0x1774a9;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_210 = (code *)0x1774b8;
    iVar1 = uv_timer_init(puVar5,&huge_timer2);
    if (iVar1 != 0) goto LAB_0017757a;
    puVar5 = &tiny_timer;
    pcStack_210 = (code *)0x1774da;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0017757f;
    puVar5 = &huge_timer1;
    pcStack_210 = (code *)0x177501;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    if (iVar1 != 0) goto LAB_00177584;
    puVar5 = &huge_timer2;
    pcStack_210 = (code *)0x177521;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    if (iVar1 != 0) goto LAB_00177589;
    pcStack_210 = (code *)0x17752a;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_210 = (code *)0x177534;
    iVar1 = uv_run(puVar5,0);
    if (iVar1 != 0) goto LAB_0017758e;
    pcStack_210 = (code *)0x17753d;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_210 = (code *)0x177551;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_210 = (code *)0x17755b;
    uv_run(unaff_RBX,0);
    pcStack_210 = (code *)0x177560;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_210 = (code *)0x177568;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_210 = (code *)0x177575;
    run_test_timer_huge_timeout_cold_1();
LAB_00177575:
    pcStack_210 = (code *)0x17757a;
    run_test_timer_huge_timeout_cold_2();
LAB_0017757a:
    pcStack_210 = (code *)0x17757f;
    run_test_timer_huge_timeout_cold_3();
LAB_0017757f:
    pcStack_210 = (code *)0x177584;
    run_test_timer_huge_timeout_cold_4();
LAB_00177584:
    pcStack_210 = (code *)0x177589;
    run_test_timer_huge_timeout_cold_5();
LAB_00177589:
    pcStack_210 = (code *)0x17758e;
    run_test_timer_huge_timeout_cold_6();
LAB_0017758e:
    pcStack_210 = (code *)0x177593;
    run_test_timer_huge_timeout_cold_7();
  }
  pcStack_210 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_8();
  if (puVar5 == &tiny_timer) {
    pcStack_218 = (code *)0x1775b3;
    uv_close(&tiny_timer,0);
    pcStack_218 = (code *)0x1775c1;
    uv_close(&huge_timer1,0);
    iVar1 = uv_close(&huge_timer2,0);
    return iVar1;
  }
  pcStack_218 = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_220 = (code *)0x1775db;
  pcStack_218 = (code *)unaff_RBX;
  puVar5 = (uv_timer_t *)uv_default_loop();
  pcStack_220 = (code *)0x1775ea;
  iVar1 = uv_timer_init(puVar5,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_220 = (code *)0x1775f7;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_220 = (code *)0x177606;
    iVar1 = uv_timer_init(puVar5,&huge_timer1);
    if (iVar1 != 0) goto LAB_001776a2;
    puVar5 = &tiny_timer;
    pcStack_220 = (code *)0x17762b;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_001776a7;
    puVar5 = &huge_timer1;
    pcStack_220 = (code *)0x17764e;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_001776ac;
    pcStack_220 = (code *)0x177657;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_220 = (code *)0x177661;
    iVar1 = uv_run(puVar5,0);
    if (iVar1 != 0) goto LAB_001776b1;
    pcStack_220 = (code *)0x17766a;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_220 = (code *)0x17767e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_220 = (code *)0x177688;
    uv_run(unaff_RBX,0);
    pcStack_220 = (code *)0x17768d;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_220 = (code *)0x177695;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_220 = (code *)0x1776a2;
    run_test_timer_huge_repeat_cold_1();
LAB_001776a2:
    pcStack_220 = (code *)0x1776a7;
    run_test_timer_huge_repeat_cold_2();
LAB_001776a7:
    pcStack_220 = (code *)0x1776ac;
    run_test_timer_huge_repeat_cold_3();
LAB_001776ac:
    pcStack_220 = (code *)0x1776b1;
    run_test_timer_huge_repeat_cold_4();
LAB_001776b1:
    pcStack_220 = (code *)0x1776b6;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_220 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  iVar1 = huge_repeat_cb::ncalls;
  pcStack_220._0_4_ = extraout_EAX;
  if (huge_repeat_cb::ncalls != 0) {
    if (puVar5 == &tiny_timer) goto LAB_001776e3;
    pcStack_228 = (code *)0x1776d7;
    huge_repeat_cb_cold_1();
    iVar1 = extraout_EAX_00;
  }
  if (puVar5 == &huge_timer1) {
LAB_001776e3:
    huge_repeat_cb::ncalls = iVar1 + 1;
    if (huge_repeat_cb::ncalls == 10) {
      pcStack_228 = (code *)0x1776fe;
      uv_close(&tiny_timer,0);
      iVar1 = uv_close(&huge_timer1,0);
      return iVar1;
    }
    return (int)pcStack_220;
  }
  pcStack_228 = run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  pcStack_228 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_2c0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_2c0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_00177823;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177828;
    if (timer_run_once_timer_cb_called != 1) goto LAB_0017782d;
    iVar1 = uv_timer_start(auStack_2c0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00177832;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177837;
    if (timer_run_once_timer_cb_called != 2) goto LAB_0017783c;
    uv_close(auStack_2c0,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00177846;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_00177823:
    run_test_timer_run_once_cold_2();
LAB_00177828:
    run_test_timer_run_once_cold_3();
LAB_0017782d:
    run_test_timer_run_once_cold_4();
LAB_00177832:
    run_test_timer_run_once_cold_5();
LAB_00177837:
    run_test_timer_run_once_cold_6();
LAB_0017783c:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_00177846:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(timer_init) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  ASSERT(0 == uv_timer_get_repeat(&handle));
  ASSERT(0 == uv_is_active((uv_handle_t*) &handle));

  MAKE_VALGRIND_HAPPY();
  return 0;
}